

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.cc
# Opt level: O3

int __thiscall Array::subsequence(Array *this,Array_S *ar)

{
  element_type *peVar1;
  long lVar2;
  long lVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  element_type *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48 = (element_type *)0x0;
  a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uVar5 = this->theSize;
  local_68 = (ar->super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar11 = local_68->theSize;
  local_58 = this;
  if ((int)uVar11 < (int)uVar5) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&_Stack_60,&(ar->super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Array*>(&_Stack_50,this);
    local_48 = local_58;
    a_Stack_40[0]._M_pi = _Stack_50._M_pi;
    iVar7 = -1;
    uVar8 = uVar5;
    uVar5 = uVar11;
  }
  else {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Array*>(&_Stack_50,this);
    _Var4._M_pi = _Stack_50._M_pi;
    local_68 = local_58;
    this_00._M_pi = _Stack_60._M_pi;
    local_58 = (element_type *)0x0;
    _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    _Stack_60._M_pi = _Var4._M_pi;
    if ((this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi),
       _Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_50._M_pi);
    }
    local_48 = (ar->super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (a_Stack_40,&(ar->super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
    iVar7 = 1;
    uVar8 = uVar11;
  }
  if (0 < (int)uVar5) {
    uVar9 = 0;
    uVar11 = 0;
    do {
      uVar10 = uVar11;
      if ((int)uVar11 < (int)uVar8) {
        peVar1 = (local_68->theArray).
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        lVar2 = (long)(peVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start;
        if ((ulong)((long)(peVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish - lVar2 >> 2) <= uVar9) {
LAB_0010e79d:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar9);
        }
        peVar1 = (local_48->theArray).
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        lVar3 = (long)(peVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start;
        uVar6 = (long)(peVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish - lVar3 >> 2;
        uVar13 = (ulong)(int)uVar11;
        iVar14 = 0;
        uVar12 = uVar13;
        do {
          if (uVar6 <= uVar12) {
            uVar9 = uVar13;
            if (uVar13 < uVar6) {
              uVar9 = uVar6;
            }
            goto LAB_0010e79d;
          }
          if (*(int *)(lVar2 + uVar9 * 4) == *(int *)(lVar3 + uVar12 * 4)) {
            uVar10 = uVar11 - iVar14;
            uVar11 = uVar10 + 1;
            break;
          }
          uVar12 = uVar12 + 1;
          iVar14 = iVar14 + -1;
          uVar10 = uVar8;
        } while ((long)(int)uVar8 != uVar12);
      }
      if (local_48->theSize <= (int)uVar10) {
        iVar7 = 0;
        break;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar5);
  }
  if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
  }
  if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_60._M_pi);
  }
  return iVar7;
}

Assistant:

int Array::subsequence(Array_S ar) {
    int i, j;
    int sz1, sz2;
    Array_S ar1, ar2;
    int retval;

    if (theSize <= ar->theSize) {
        sz1 = theSize;
        sz2 = ar->theSize;
        ar1 = shared_ptr<Array>(this);
        ar2 = ar;
        retval = 1;
    } else {
        sz1 = ar->theSize;
        sz2 = theSize;
        ar1 = ar;
        ar2 = shared_ptr<Array>(this);
        retval = -1;
    }
    int start = 0;
    for (i = 0; i < sz1; i++) {
        for (j = start; j < sz2; j++) {
            if (ar1->theArray->at(i) == ar2->theArray->at(j)) {
                start = j + 1;
                break;
            }
        }
        if (j >= ar2->theSize) return 0;
    }
    return retval;
}